

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

void * __thiscall mjs::gc_heap_ptr_untyped::get(gc_heap_ptr_untyped *this)

{
  uint uVar1;
  gc_heap *pgVar2;
  
  pgVar2 = this->heap_;
  if (pgVar2 == (gc_heap *)0x0) {
    __assert_fail("heap_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x1a2,"void *mjs::gc_heap_ptr_untyped::get() const");
  }
  uVar1 = this->pos_;
  if (((pgVar2->alloc_context_).start_ <= uVar1) && (uVar1 < (pgVar2->alloc_context_).next_free_)) {
    return (pgVar2->alloc_context_).storage_ + uVar1;
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

void* get() const {
        assert(heap_);
        return heap().get_at(pos_);
    }